

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint8_t *local_60;
  size_t __y;
  unsigned_long __x;
  size_t take;
  uint8_t *bout;
  size_t nout_local;
  void *out_local;
  size_t naddnl_local;
  void *addnl_local;
  cf_hmac_drbg *ctx_local;
  
  take = (size_t)out;
  out_local = (void *)naddnl;
  naddnl_local = (size_t)addnl;
  for (bout = (uint8_t *)nout; bout != (uint8_t *)0x0; bout = bout + -(long)local_60) {
    if (bout < (uint8_t *)0x10001) {
      local_60 = bout;
    }
    else {
      local_60 = (uint8_t *)0x10000;
    }
    hmac_drbg_generate(ctx,(void *)naddnl_local,(size_t)out_local,(void *)take,(size_t)local_60);
    take = (size_t)(local_60 + take);
    naddnl_local = 0;
    out_local = (void *)0x0;
  }
  return;
}

Assistant:

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,
                                 const void *addnl, size_t naddnl,
                                 void *out, size_t nout)
{
  uint8_t *bout = out;

  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hmac_drbg_generate(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}